

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::AggregateType::AggregateType
          (AggregateType *this,KUINT8 Kind,KUINT8 Domain,KUINT8 Country,KUINT8 Categoy,
          KUINT8 SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  undefined3 in_register_00000009;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__AggregateType_0022a4a0;
  this->m_ui8Kind = Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (KUINT16)CONCAT31(in_register_00000009,Country);
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

AggregateType::AggregateType( KUINT8 Kind, KUINT8  Domain, KUINT8 Country, KUINT8  Categoy,
                              KUINT8  SubCategory, KUINT8  Specific, KUINT8  Extra ) :
    m_ui8Kind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}